

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O3

void __thiscall Clasp::BasicSolve::reset(BasicSolve *this,bool reinit)

{
  State *pSVar1;
  
  pSVar1 = this->state_;
  if (pSVar1 == (State *)0x0 || reinit) {
    if (pSVar1 != (State *)0x0) {
      SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::reset
                (&pSVar1->dynRestart,(DynamicLimit *)0x0);
      SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject>::reset
                (&pSVar1->rsBlock,(BlockLimit *)0x0);
    }
    operator_delete(pSVar1);
    this->state_ = (State *)0x0;
    return;
  }
  SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::reset
            (&pSVar1->dynRestart,(DynamicLimit *)0x0);
  SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject>::reset(&pSVar1->rsBlock,(BlockLimit *)0x0);
  State::State(this->state_,this->solver_,this->params_);
  return;
}

Assistant:

void BasicSolve::reset(bool reinit) {
	if (!state_ || reinit) {
		delete state_;
		state_ = 0;
	}
	else {
		state_->~State();
		new (state_) State(*solver_, *params_);
	}
}